

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaPSVIIDCNodePtr **pppxVar1;
  xmlSchemaPSVIIDCKeyPtr **pppxVar2;
  xmlSchemaIDCAugPtr pxVar3;
  xmlSchemaPSVIIDCNodePtr pxVar4;
  xmlSchemaIDCMatcherPtr pxVar5;
  xmlSchemaIDCMatcherPtr pxVar6;
  void *pvVar7;
  xmlDictPtr pxVar8;
  int i_2;
  int i_4;
  xmlSchemaIDCAugPtr_conflict pxVar9;
  xmlSchemaItemListPtr pxVar10;
  int i;
  long lVar11;
  int i_1;
  xmlSchemaIDCMatcherPtr_conflict pxVar12;
  xmlSchemaIDCMatcherPtr_conflict pxVar13;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  vctxt->flags = 0;
  vctxt->validationRoot = (xmlNodePtr)0x0;
  vctxt->doc = (xmlDocPtr)0x0;
  vctxt->reader = (xmlTextReaderPtr)0x0;
  vctxt->hasKeyrefs = 0;
  if (vctxt->value != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(vctxt->value);
    vctxt->value = (xmlSchemaValPtr)0x0;
  }
  pxVar9 = vctxt->aidcs;
  if (pxVar9 != (xmlSchemaIDCAugPtr_conflict)0x0) {
    do {
      pxVar3 = pxVar9->next;
      (*xmlFree)(pxVar9);
      pxVar9 = pxVar3;
    } while (pxVar3 != (xmlSchemaIDCAugPtr)0x0);
    vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
  }
  if (vctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
    pppxVar1 = &vctxt->idcNodes;
    for (lVar11 = 0; lVar11 < vctxt->nbIdcNodes; lVar11 = lVar11 + 1) {
      pxVar4 = (*pppxVar1)[lVar11];
      (*xmlFree)(pxVar4->keys);
      (*xmlFree)(pxVar4);
    }
    (*xmlFree)(*pppxVar1);
    *pppxVar1 = (xmlSchemaPSVIIDCNodePtr *)0x0;
    vctxt->nbIdcNodes = 0;
    vctxt->sizeIdcNodes = 0;
  }
  if (vctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
    pppxVar2 = &vctxt->idcKeys;
    for (lVar11 = 0; lVar11 < vctxt->nbIdcKeys; lVar11 = lVar11 + 1) {
      xmlSchemaIDCFreeKey((*pppxVar2)[lVar11]);
    }
    (*xmlFree)(*pppxVar2);
    *pppxVar2 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
    vctxt->nbIdcKeys = 0;
    vctxt->sizeIdcKeys = 0;
  }
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
    vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  }
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  if (vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) {
    for (lVar11 = 0;
        (lVar11 < vctxt->sizeElemInfos && (vctxt->elemInfos[lVar11] != (xmlSchemaNodeInfoPtr)0x0));
        lVar11 = lVar11 + 1) {
      xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[lVar11]);
    }
  }
  pxVar10 = vctxt->nodeQNames;
  if (pxVar10->items != (void **)0x0) {
    (*xmlFree)(pxVar10->items);
    pxVar10->items = (void **)0x0;
  }
  pxVar10->nbItems = 0;
  pxVar10->sizeItems = 0;
  xmlDictFree(vctxt->dict);
  pxVar8 = xmlDictCreate();
  vctxt->dict = pxVar8;
  if (vctxt->filename != (char *)0x0) {
    (*xmlFree)(vctxt->filename);
    vctxt->filename = (char *)0x0;
  }
  pxVar12 = vctxt->idcMatcherCache;
  if (vctxt->idcMatcherCache != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    while (pxVar12 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
      pxVar5 = pxVar12->nextCached;
      pxVar13 = pxVar12;
      while (pxVar12 = pxVar5, pxVar13 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
        pxVar6 = pxVar13->next;
        if (pxVar13->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
          for (lVar11 = 0; lVar11 < pxVar13->sizeKeySeqs; lVar11 = lVar11 + 1) {
            if (pxVar13->keySeqs[lVar11] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
              (*xmlFree)(pxVar13->keySeqs[lVar11]);
            }
          }
          (*xmlFree)(pxVar13->keySeqs);
        }
        pxVar10 = pxVar13->targets;
        if (pxVar10 != (xmlSchemaItemListPtr)0x0) {
          if (pxVar13->idcType == 0x18) {
            for (lVar11 = 0; lVar11 < pxVar10->nbItems; lVar11 = lVar11 + 1) {
              pvVar7 = pxVar10->items[lVar11];
              (*xmlFree)(*(void **)((long)pvVar7 + 8));
              (*xmlFree)(pvVar7);
              pxVar10 = pxVar13->targets;
            }
          }
          xmlSchemaItemListFree(pxVar10);
        }
        if (pxVar13->htab != (xmlHashTablePtr)0x0) {
          xmlHashFree(pxVar13->htab,xmlFreeIDCHashEntry);
        }
        (*xmlFree)(pxVar13);
        pxVar13 = pxVar6;
      }
    }
    vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}